

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWriteCnf2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  uint local_50;
  int fVerbose;
  int c;
  int fAddOrCla;
  int fCnfObjIds;
  int fNewAlgo;
  int nLutSize;
  char *pFileName;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fCnfObjIds = 6;
  bVar1 = true;
  c = 0;
  fVerbose = 1;
  local_50 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"Kaiovh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"IoCommandWriteCnf2(): There is no AIG.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar2 = Gia_ManRegNum(pAbc->pGia);
        if (iVar2 < 1) {
          if ((fCnfObjIds < 3) || (8 < fCnfObjIds)) {
            Abc_Print(-1,"IoCommandWriteCnf2(): Invalid LUT size (%d).\n",(ulong)(uint)fCnfObjIds);
            pAbc_local._4_4_ = 0;
          }
          else if ((bVar1) || (iVar2 = Sdm_ManCanRead(), iVar2 != 0)) {
            if (argc == globalUtilOptind + 1) {
              pcVar3 = argv[globalUtilOptind];
              __stream = fopen(pcVar3,"wb");
              if (__stream == (FILE *)0x0) {
                printf("Cannot open file \"%s\" for writing.\n",pcVar3);
                pAbc_local._4_4_ = 0;
              }
              else {
                fclose(__stream);
                if (bVar1) {
                  Mf_ManDumpCnf(pAbc->pGia,pcVar3,fCnfObjIds,c,fVerbose,local_50);
                }
                else {
                  Jf_ManDumpCnf(pAbc->pGia,pcVar3,local_50);
                }
                pAbc_local._4_4_ = 0;
              }
            }
            else {
LAB_0033b4c4:
              fprintf((FILE *)pAbc->Err,"usage: &write_cnf [-Kaiovh] <file>\n");
              fprintf((FILE *)pAbc->Err,"\t           writes CNF produced by a new generator\n");
              fprintf((FILE *)pAbc->Err,"\t-K <num> : the LUT size (3 <= num <= 8) [default = %d]\n"
                      ,(ulong)(uint)fCnfObjIds);
              pcVar3 = "no";
              if (bVar1) {
                pcVar3 = "yes";
              }
              fprintf((FILE *)pAbc->Err,"\t-a       : toggle using new algorithm [default = %s]\n",
                      pcVar3);
              pcVar3 = "no";
              if (c != 0) {
                pcVar3 = "yes";
              }
              fprintf((FILE *)pAbc->Err,
                      "\t-i       : toggle using AIG object IDs as CNF variables [default = %s]\n",
                      pcVar3);
              pcVar3 = "no";
              if (fVerbose != 0) {
                pcVar3 = "yes";
              }
              fprintf((FILE *)pAbc->Err,
                      "\t-o       : toggle adding OR clause for the outputs [default = %s]\n",pcVar3
                     );
              pcVar3 = "no";
              if (local_50 != 0) {
                pcVar3 = "yes";
              }
              fprintf((FILE *)pAbc->Err,
                      "\t-v       : toggle printing verbose information [default = %s]\n",pcVar3);
              fprintf((FILE *)pAbc->Err,"\t-h       : print the help massage\n");
              fprintf((FILE *)pAbc->Err,"\tfile     : the name of the file to write\n");
              pAbc_local._4_4_ = 1;
            }
          }
          else {
            Abc_Print(-1,"IoCommandWriteCnf2(): Cannot input precomputed DSD information.\n");
            pAbc_local._4_4_ = 0;
          }
        }
        else {
          Abc_Print(-1,"IoCommandWriteCnf2(): Works only for combinational miters.\n");
          pAbc_local._4_4_ = 0;
        }
      }
      return pAbc_local._4_4_;
    }
    switch(iVar2) {
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_0033b4c4;
      }
      fCnfObjIds = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      break;
    default:
      goto LAB_0033b4c4;
    case 0x61:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x68:
      goto LAB_0033b4c4;
    case 0x69:
      c = c ^ 1;
      break;
    case 0x6f:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x76:
      local_50 = local_50 ^ 1;
    }
  } while( true );
}

Assistant:

int IoCommandWriteCnf2( Abc_Frame_t * pAbc, int argc, char **argv )
{
    extern void Jf_ManDumpCnf( Gia_Man_t * p, char * pFileName, int fVerbose );
    extern void Mf_ManDumpCnf( Gia_Man_t * p, char * pFileName, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose );
    FILE * pFile;
    char * pFileName;
    int nLutSize    = 6;
    int fNewAlgo    = 1;
    int fCnfObjIds  = 0;
    int fAddOrCla   = 1;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Kaiovh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'K':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                    goto usage;
                }
                nLutSize = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                break;
            case 'a':
                fNewAlgo ^= 1;
                break;
            case 'i':
                fCnfObjIds ^= 1;
                break;
            case 'o':
                fAddOrCla ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "IoCommandWriteCnf2(): There is no AIG.\n" );
        return 1;
    } 
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "IoCommandWriteCnf2(): Works only for combinational miters.\n" );
        return 0;
    }
    if ( nLutSize < 3 || nLutSize > 8 )
    {
        Abc_Print( -1, "IoCommandWriteCnf2(): Invalid LUT size (%d).\n", nLutSize );
        return 0;
    }
    if ( !fNewAlgo && !Sdm_ManCanRead() )
    {
        Abc_Print( -1, "IoCommandWriteCnf2(): Cannot input precomputed DSD information.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return 0;
    }
    fclose( pFile );
    if ( fNewAlgo )
        Mf_ManDumpCnf( pAbc->pGia, pFileName, nLutSize, fCnfObjIds, fAddOrCla, fVerbose );
    else
        Jf_ManDumpCnf( pAbc->pGia, pFileName, fVerbose );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: &write_cnf [-Kaiovh] <file>\n" );
    fprintf( pAbc->Err, "\t           writes CNF produced by a new generator\n" );
    fprintf( pAbc->Err, "\t-K <num> : the LUT size (3 <= num <= 8) [default = %d]\n", nLutSize );
    fprintf( pAbc->Err, "\t-a       : toggle using new algorithm [default = %s]\n", fNewAlgo? "yes" : "no" );
    fprintf( pAbc->Err, "\t-i       : toggle using AIG object IDs as CNF variables [default = %s]\n", fCnfObjIds? "yes" : "no" );
    fprintf( pAbc->Err, "\t-o       : toggle adding OR clause for the outputs [default = %s]\n", fAddOrCla? "yes" : "no" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes" : "no" );
    fprintf( pAbc->Err, "\t-h       : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile     : the name of the file to write\n" );
    return 1;
}